

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_value_test.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  testSingleValue_NoValueGiven_ShouldFail();
  testSingleValue_ValueGiven_ShouldSucceed();
  testSingleValue_MultipleValueArguments_ShouldSucceed();
  testSingleValue_NoValueGivenWithAssignment_ShouldFail();
  testSingleValue_ValueGivenWithAssignment_ShouldSucceed();
  testSingleValue_MultipleValuesGivenWithAssignments_ShouldSucceed();
  testSingleValue_NoValueGivenWithoutSpace_ShouldFail();
  testSingleValue_ValueGivenWithoutSpace_ShouldSucceed();
  testSingleValue_MultipleValuesGivenWithoutSpaces_ShouldSucceed();
  testSingleValue_RequiredButNotGiven_ShouldFail();
  testSingleValue_RequiredAndGiven_ShouldSucceed();
  testMixedArguments_MultipleArguments_ShouldSucceed();
  testSameArgumentDefinedMultipleTimes_ShouldFail();
  return 0;
}

Assistant:

int main(int, char **)
{
    testSingleValue_NoValueGiven_ShouldFail();

    testSingleValue_ValueGiven_ShouldSucceed();

    testSingleValue_MultipleValueArguments_ShouldSucceed();

    testSingleValue_NoValueGivenWithAssignment_ShouldFail();

    testSingleValue_ValueGivenWithAssignment_ShouldSucceed();

    testSingleValue_MultipleValuesGivenWithAssignments_ShouldSucceed();

    testSingleValue_NoValueGivenWithoutSpace_ShouldFail();

    testSingleValue_ValueGivenWithoutSpace_ShouldSucceed();

    testSingleValue_MultipleValuesGivenWithoutSpaces_ShouldSucceed();

    testSingleValue_RequiredButNotGiven_ShouldFail();

    testSingleValue_RequiredAndGiven_ShouldSucceed();

    testMixedArguments_MultipleArguments_ShouldSucceed();

    testSameArgumentDefinedMultipleTimes_ShouldFail();

    return EXIT_SUCCESS;
}